

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O1

void calc<float>(options *opt)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  ostream *poVar6;
  invalid_argument *this;
  float fVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> f0;
  float fVar8;
  fvar<float,_2UL> fVar9;
  get_type_at<fvar<float,_2UL>,_sizeof___(Orders)> b0;
  char *local_98;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined8 local_68;
  float fStack_60;
  float fStack_5c;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  undefined1 local_38 [16];
  
  pcVar2 = (opt->Ja)._M_dataplus._M_p;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  fVar7 = strtof(pcVar2,&local_98);
  if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) {
    std::__throw_invalid_argument("stof");
LAB_001093ea:
    std::__throw_invalid_argument("stof");
LAB_001093f6:
    std::__throw_invalid_argument("stof");
LAB_00109402:
    std::__throw_invalid_argument("stof");
LAB_0010940e:
    std::__throw_invalid_argument("stof");
LAB_0010941a:
    std::__throw_invalid_argument("stof");
  }
  else {
    local_84 = fVar7;
    if (*piVar4 == 0) {
LAB_00108f4d:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108f4d;
    }
    pcVar2 = (opt->Jb)._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar7 = strtof(pcVar2,&local_98);
    if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) goto LAB_001093ea;
    local_88 = fVar7;
    if (*piVar4 == 0) {
LAB_00108f90:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108f90;
    }
    pcVar2 = (opt->Jc)._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar7 = strtof(pcVar2,&local_98);
    if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) goto LAB_001093f6;
    local_8c = fVar7;
    if (*piVar4 == 0) {
LAB_00108fd3:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00108fd3;
    }
    pcVar2 = (opt->Tmin)._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar7 = strtof(pcVar2,&local_98);
    if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) goto LAB_00109402;
    local_90 = fVar7;
    if (*piVar4 == 0) {
LAB_00109016:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_00109016;
    }
    pcVar2 = (opt->Tmax)._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    local_78._0_4_ = strtof(pcVar2,&local_98);
    if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) goto LAB_0010940e;
    if (*piVar4 == 0) {
LAB_0010905c:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      std::__throw_out_of_range("stof");
      goto LAB_0010905c;
    }
    pcVar2 = (opt->dT)._M_dataplus._M_p;
    iVar1 = *piVar4;
    *piVar4 = 0;
    fVar7 = strtof(pcVar2,&local_98);
    if ((char *)CONCAT71(local_98._1_7_,local_98._0_1_) == pcVar2) goto LAB_0010941a;
    fVar8 = local_90;
    if (*piVar4 == 0) {
LAB_001090a1:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      fVar7 = (float)std::__throw_out_of_range("stof");
      goto LAB_001090a1;
    }
    lVar3 = std::cout;
    if (fVar8 <= (float)local_78._0_4_) {
      local_80 = fVar7;
      if (0.0 < fVar7) {
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
             0x100;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar3 + -0x18)) = 6;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# lattice: triangular\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"# precision: ",0xd);
        plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,6);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        poVar6 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,"# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n",0x23);
        local_40 = (double)local_80 * 0.0001 + (double)(float)local_78._0_4_;
        local_68 = (double)local_90;
        if (local_68 < local_40) {
          local_48 = (double)local_84;
          local_50 = (double)local_88;
          local_58 = (double)local_8c;
          do {
            local_78 = ZEXT416((uint)(1.0 / local_90));
            fVar9.v._M_elems[1] = 1.0;
            fVar9.v._M_elems[0] = 1.0 / local_90;
            fVar9.v._M_elems[2] = 0.0;
            fVar9 = ising::free_energy::triangular::
                    infinite<float,boost::math::differentiation::autodiff_v1::detail::fvar<float,2ul>>
                              (local_84,local_88,local_8c,fVar9);
            local_7c = fVar9.v._M_elems[2];
            local_38._8_4_ = extraout_XMM0_Dc;
            local_38._0_8_ = fVar9.v._M_elems._0_8_;
            local_38._12_4_ = extraout_XMM0_Dd;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8);
            poVar6 = std::ostream::_M_insert<double>(local_48);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>(local_50);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>(local_58);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>(local_68);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>((double)(float)local_38._0_4_);
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            local_68 = (double)CONCAT44(local_38._4_4_,local_38._4_4_);
            fStack_60 = (float)local_38._4_4_;
            fStack_5c = (float)local_38._4_4_;
            poVar6 = std::ostream::_M_insert<double>
                               ((double)((float)local_78._0_4_ * (float)local_38._4_4_ +
                                        (float)local_38._0_4_));
            local_98._0_1_ = 0x20;
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_98,1);
            poVar6 = std::ostream::_M_insert<double>
                               ((double)(-(float)local_78._0_4_ * (float)local_78._0_4_ *
                                        ((float)local_68 + (float)local_68 +
                                        (local_7c + local_7c) * (float)local_78._0_4_)));
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            local_90 = local_90 + local_80;
            local_68 = (double)local_90;
          } while (local_68 < local_40);
        }
        return;
      }
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"dT should be positive");
      goto LAB_00109460;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
LAB_00109460:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options &opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Ja = convert<real_t>(opt.Ja);
  real_t Jb = convert<real_t>(opt.Jb);
  real_t Jc = convert<real_t>(opt.Jc);
  real_t Tmin = convert<real_t>(opt.Tmin);
  real_t Tmax = convert<real_t>(opt.Tmax);
  real_t dT = convert<real_t>(opt.dT);
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Ja Jb Jc T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    auto beta = boost::math::differentiation::make_fvar<real_t, 2>(1 / t);
    auto f = triangular::infinite(Ja, Jb, Jc, beta);
    std::cout << "inf inf " << Ja << ' ' << Jb << ' ' << Jc << ' ' << t << ' '
              << (1 / t) << ' ' << free_energy(f, beta) << ' '
              << energy(f, beta) << ' ' << specific_heat(f, beta) << std::endl;
  }
}